

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unary.cpp
# Opt level: O0

string * __thiscall
DragonParser::InterNamespace::Unary::to_string_abi_cxx11_
          (string *__return_storage_ptr__,Unary *this)

{
  string local_88;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Unary *local_18;
  Unary *this_local;
  
  local_18 = this;
  this_local = (Unary *)__return_storage_ptr__;
  LexerNamespace::Token::to_string_abi_cxx11_(&local_58,&(this->super_Op).super_Expr.op);
  std::operator+(&local_38,&local_58," ");
  Expr::to_string_abi_cxx11_(&local_88,&this->expr);
  std::operator+(__return_storage_ptr__,&local_38,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

string Unary::to_string() const {
        return op.to_string() + " " + expr.to_string();
    }